

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.cpp
# Opt level: O1

int __thiscall ncnn::Permute::forward(Permute *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _c;
  uint _h;
  uint _w;
  int iVar1;
  size_t sVar2;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 *puVar12;
  long lVar13;
  ulong uVar14;
  void *pvVar15;
  undefined4 *puVar16;
  void *pvVar17;
  void *pvVar18;
  undefined4 *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  
  if ((uint)this->order_type < 6) {
    _c = bottom_blob->w;
    uVar11 = (ulong)_c;
    _h = bottom_blob->h;
    uVar21 = (ulong)_h;
    _w = bottom_blob->c;
    uVar22 = (ulong)_w;
    sVar2 = bottom_blob->elemsize;
    switch(this->order_type) {
    case 0:
      if (top_blob != bottom_blob) {
        piVar3 = bottom_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(*(void **)((long)top_blob->data + -8));
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 8))();
            }
          }
        }
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->elemsize = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->c = 0;
        top_blob->cstep = 0;
        piVar3 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar3;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->allocator = bottom_blob->allocator;
        iVar1 = bottom_blob->w;
        iVar7 = bottom_blob->h;
        iVar8 = bottom_blob->c;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar1;
        top_blob->h = iVar7;
        top_blob->c = iVar8;
        top_blob->cstep = bottom_blob->cstep;
        return 0;
      }
      return 0;
    case 1:
      Mat::create(top_blob,_h,_c,_w,sVar2,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if ((int)_w < 1) {
        return 0;
      }
      puVar16 = (undefined4 *)bottom_blob->data;
      sVar2 = bottom_blob->cstep;
      pvVar9 = top_blob->data;
      sVar4 = top_blob->cstep;
      sVar5 = top_blob->elemsize;
      sVar6 = bottom_blob->elemsize;
      uVar14 = 0;
      do {
        if (0 < (int)_c) {
          uVar20 = 0;
          puVar12 = puVar16;
          pvVar18 = pvVar9;
          do {
            if (0 < (int)_h) {
              uVar10 = 0;
              puVar19 = puVar12;
              do {
                *(undefined4 *)((long)pvVar18 + uVar10 * 4) = *puVar19;
                uVar10 = uVar10 + 1;
                puVar19 = puVar19 + uVar11;
              } while (uVar21 != uVar10);
            }
            uVar20 = uVar20 + 1;
            pvVar18 = (void *)((long)pvVar18 + uVar21 * 4);
            puVar12 = puVar12 + 1;
          } while (uVar20 != uVar11);
        }
        uVar14 = uVar14 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar4 * sVar5);
        puVar16 = (undefined4 *)((long)puVar16 + sVar2 * sVar6);
      } while (uVar14 != uVar22);
      break;
    case 2:
      Mat::create(top_blob,_c,_w,_h,sVar2,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if ((int)_h < 1) {
        return 0;
      }
      pvVar9 = top_blob->data;
      sVar2 = top_blob->cstep;
      iVar1 = bottom_blob->w;
      pvVar18 = bottom_blob->data;
      sVar4 = bottom_blob->cstep;
      sVar5 = top_blob->elemsize;
      sVar6 = bottom_blob->elemsize;
      uVar14 = 0;
      do {
        if (0 < (int)_w) {
          uVar20 = 0;
          pvVar15 = pvVar18;
          pvVar17 = pvVar9;
          do {
            if (0 < (int)_c) {
              uVar10 = 0;
              do {
                *(undefined4 *)((long)pvVar17 + uVar10 * 4) =
                     *(undefined4 *)((long)pvVar15 + uVar10 * 4);
                uVar10 = uVar10 + 1;
              } while (uVar11 != uVar10);
            }
            uVar20 = uVar20 + 1;
            pvVar17 = (void *)((long)pvVar17 + uVar11 * 4);
            pvVar15 = (void *)((long)pvVar15 + sVar4 * sVar6);
          } while (uVar20 != uVar22);
        }
        uVar14 = uVar14 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar5);
        pvVar18 = (void *)((long)pvVar18 + (long)iVar1 * 4);
      } while (uVar14 != uVar21);
      break;
    case 3:
      Mat::create(top_blob,_w,_c,_h,sVar2,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if ((int)_h < 1) {
        return 0;
      }
      pvVar9 = top_blob->data;
      sVar2 = top_blob->cstep;
      sVar4 = top_blob->elemsize;
      uVar14 = 0;
      do {
        if (0 < (int)_c) {
          sVar5 = bottom_blob->cstep;
          puVar16 = (undefined4 *)
                    ((long)(bottom_blob->w * (int)uVar14) * 4 + (long)bottom_blob->data);
          sVar6 = bottom_blob->elemsize;
          uVar20 = 0;
          pvVar18 = pvVar9;
          do {
            if (0 < (int)_w) {
              uVar10 = 0;
              puVar12 = puVar16;
              do {
                *(undefined4 *)((long)pvVar18 + uVar10 * 4) = *puVar12;
                uVar10 = uVar10 + 1;
                puVar12 = (undefined4 *)((long)puVar12 + sVar5 * sVar6);
              } while (uVar22 != uVar10);
            }
            uVar20 = uVar20 + 1;
            pvVar18 = (void *)((long)pvVar18 + uVar22 * 4);
            puVar16 = puVar16 + 1;
          } while (uVar20 != uVar11);
        }
        uVar14 = uVar14 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar4);
      } while (uVar14 != uVar21);
      break;
    case 4:
      Mat::create(top_blob,_h,_w,_c,sVar2,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if ((int)_c < 1) {
        return 0;
      }
      pvVar9 = top_blob->data;
      sVar2 = top_blob->cstep;
      puVar16 = (undefined4 *)bottom_blob->data;
      sVar4 = bottom_blob->cstep;
      sVar5 = top_blob->elemsize;
      sVar6 = bottom_blob->elemsize;
      uVar14 = 0;
      do {
        if (0 < (int)_w) {
          uVar20 = 0;
          puVar12 = puVar16;
          pvVar18 = pvVar9;
          do {
            if (0 < (int)_h) {
              uVar10 = 0;
              puVar19 = puVar12;
              do {
                *(undefined4 *)((long)pvVar18 + uVar10 * 4) = *puVar19;
                uVar10 = uVar10 + 1;
                puVar19 = puVar19 + uVar11;
              } while (uVar21 != uVar10);
            }
            uVar20 = uVar20 + 1;
            pvVar18 = (void *)((long)pvVar18 + uVar22 * 4);
            puVar12 = (undefined4 *)((long)puVar12 + sVar4 * sVar6);
          } while (uVar20 != uVar22);
        }
        uVar14 = uVar14 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar5);
        puVar16 = puVar16 + 1;
      } while (uVar14 != uVar11);
      break;
    case 5:
      Mat::create(top_blob,_w,_h,_c,sVar2,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if ((int)_c < 1) {
        return 0;
      }
      pvVar9 = top_blob->data;
      sVar2 = top_blob->cstep;
      sVar4 = top_blob->elemsize;
      lVar13 = 0;
      uVar14 = 0;
      do {
        if (0 < (int)_h) {
          sVar5 = bottom_blob->cstep;
          sVar6 = bottom_blob->elemsize;
          puVar16 = (undefined4 *)((long)bottom_blob->data + lVar13);
          uVar20 = 0;
          pvVar18 = pvVar9;
          do {
            if (0 < (int)_w) {
              uVar10 = 0;
              puVar12 = puVar16;
              do {
                *(undefined4 *)((long)pvVar18 + uVar10 * 4) = *puVar12;
                uVar10 = uVar10 + 1;
                puVar12 = (undefined4 *)((long)puVar12 + sVar5 * sVar6);
              } while (uVar22 != uVar10);
            }
            uVar20 = uVar20 + 1;
            pvVar18 = (void *)((long)pvVar18 + uVar22 * 4);
            puVar16 = puVar16 + uVar11;
          } while (uVar20 != uVar21);
        }
        uVar14 = uVar14 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar4);
        lVar13 = lVar13 + 4;
      } while (uVar14 != uVar11);
    }
  }
  return 0;
}

Assistant:

int Permute::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    // order_type
    // 0 = w h c
    // 1 = h w c
    // 2 = w c h
    // 3 = c w h
    // 4 = h c w
    // 5 = c h w

    if (order_type == 0)
    {
        top_blob = bottom_blob;
    }
    else if (order_type == 1)
    {
        top_blob.create(h, w, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    outptr[i*h + j] = ptr[j*w + i];
                }
            }
        }
    }
    else if (order_type == 2)
    {
        top_blob.create(w, channels, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<h; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < channels; i++)
            {
                const float* ptr = bottom_blob.channel(i).row(q);

                for (int j = 0; j < w; j++)
                {
                    outptr[i*w + j] = ptr[j];
                }
            }
        }
    }
    else if (order_type == 3)
    {
        top_blob.create(channels, w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<h; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < channels; j++)
                {
                    const float* ptr = bottom_blob.channel(j).row(q);

                    outptr[i*channels + j] = ptr[i];
                }
            }
        }
    }
    else if (order_type == 4)
    {
        top_blob.create(h, channels, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<w; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < channels; i++)
            {
                const float* ptr = bottom_blob.channel(i);

                for (int j = 0; j < h; j++)
                {
                    outptr[i*channels + j] = ptr[j*w + q];
                }
            }
        }
    }
    else if (order_type == 5)
    {
        top_blob.create(channels, h, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<w; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < channels; j++)
                {
                    const float* ptr = bottom_blob.channel(j);

                    outptr[i*channels + j] = ptr[i*w + q];
                }
            }
        }
    }

    return 0;
}